

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O2

c_v128 c_v128_zip_32(c_v64 a,c_v64 b)

{
  c_v128 cVar1;
  
  cVar1._8_8_ = a.u64 & 0xffffffff00000000 | b.u64 >> 0x20;
  cVar1._0_8_ = b.u64 & 0xffffffff | a.u64 << 0x20;
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 _c_v64_zip_32(c_v64 a, c_v64 b, int mode) {
  c_v64 t;
  if (mode) {
    t.u32[1] = a.u32[1];
    t.u32[0] = b.u32[1];
  } else {
    t.u32[1] = a.u32[0];
    t.u32[0] = b.u32[0];
  }
  return t;
}